

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorTest.cpp
# Opt level: O3

void relational_operator<std::vector<int,std::allocator<int>>>
               (vector<int,_std::allocator<int>_> *t1,char *s1,vector<int,_std::allocator<int>_> *t2
               ,char *s2)

{
  int *piVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  int *piVar5;
  long lVar6;
  int *piVar7;
  int *piVar8;
  int *__s1;
  int *__s2;
  size_t __n;
  
  if (s1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10c0c8);
  }
  else {
    sVar3 = strlen(s1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,s1,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," is...",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  __s1 = (t1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_start;
  piVar5 = (t1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  __n = (long)piVar5 - (long)__s1;
  __s2 = (t2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_start;
  piVar7 = (t2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  sVar3 = (long)piVar7 - (long)__s2;
  if ((__n == sVar3) && ((piVar5 == __s1 || (iVar2 = bcmp(__s1,__s2,__n), iVar2 == 0)))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"equal to",8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    __s1 = (t1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
    piVar5 = (t1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    __s2 = (t2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
    piVar7 = (t2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    __n = (long)piVar5 - (long)__s1;
    sVar3 = (long)piVar7 - (long)__s2;
  }
  if ((__n != sVar3) ||
     ((piVar8 = __s1, piVar5 != __s1 && (iVar2 = bcmp(__s1,__s2,__n), piVar8 = piVar5, iVar2 != 0)))
     ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"not equal to",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    __s1 = (t1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
    __s2 = (t2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
    piVar7 = (t2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    sVar3 = (long)piVar7 - (long)__s2;
    piVar8 = (t1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
  }
  lVar6 = (long)piVar8 - (long)__s1;
  piVar5 = __s1;
  piVar1 = __s2;
  piVar4 = (int *)(sVar3 + (long)__s1);
  if (lVar6 <= (long)sVar3) {
    piVar4 = piVar8;
  }
  for (; piVar4 != piVar5; piVar5 = piVar5 + 1) {
    if (*piVar5 < *piVar1) goto LAB_0010623d;
    if (*piVar1 < *piVar5) goto LAB_0010629a;
    piVar1 = piVar1 + 1;
  }
  if (piVar1 != piVar7) {
LAB_0010623d:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"smaller than",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    __s2 = (t2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
    piVar7 = (t2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    __s1 = (t1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
    piVar8 = (t1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    sVar3 = (long)piVar7 - (long)__s2;
    lVar6 = (long)piVar8 - (long)__s1;
  }
LAB_0010629a:
  piVar5 = __s1;
  piVar1 = __s2;
  piVar4 = (int *)((long)__s2 + lVar6);
  if ((long)sVar3 <= lVar6) {
    piVar4 = piVar7;
  }
  for (; piVar4 != piVar1; piVar1 = piVar1 + 1) {
    if (*piVar1 < *piVar5) goto LAB_0010632c;
    if (*piVar5 < *piVar1) goto LAB_001062cf;
    piVar5 = piVar5 + 1;
  }
  if (piVar5 == piVar8) {
LAB_001062cf:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"smaller than or equal to",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    __s2 = (t2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
    piVar7 = (t2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    __s1 = (t1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
    piVar8 = (t1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    sVar3 = (long)piVar7 - (long)__s2;
    lVar6 = (long)piVar8 - (long)__s1;
  }
LAB_0010632c:
  piVar5 = __s1;
  piVar1 = __s2;
  piVar4 = (int *)((long)__s2 + lVar6);
  if ((long)sVar3 <= lVar6) {
    piVar4 = piVar7;
  }
  for (; piVar4 != piVar1; piVar1 = piVar1 + 1) {
    if (*piVar1 < *piVar5) goto LAB_00106361;
    if (*piVar5 < *piVar1) goto LAB_001063be;
    piVar5 = piVar5 + 1;
  }
  if (piVar5 != piVar8) {
LAB_00106361:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"greater than",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    __s1 = (t1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
    piVar8 = (t1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    __s2 = (t2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
    piVar7 = (t2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    lVar6 = (long)piVar8 - (long)__s1;
    sVar3 = (long)piVar7 - (long)__s2;
  }
LAB_001063be:
  piVar5 = (int *)(sVar3 + (long)__s1);
  if (lVar6 <= (long)sVar3) {
    piVar5 = piVar8;
  }
  for (; piVar5 != __s1; __s1 = __s1 + 1) {
    if (*__s1 < *__s2) goto LAB_00106432;
    if (*__s2 < *__s1) goto LAB_001063f7;
    __s2 = __s2 + 1;
  }
  if (__s2 == piVar7) {
LAB_001063f7:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"greater than or equal to",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
  }
LAB_00106432:
  if (s2 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10c0c8);
  }
  else {
    sVar3 = strlen(s2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,s2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"!\n",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  return;
}

Assistant:

void 	relational_operator(T const & t1, char const * s1, T const & t2, char const * s2) {
	std::cout << s1 << " is..." << std::endl;

	if (t1 == t2) std::cout << "equal to" << std::endl;
	if (t1 != t2) std::cout << "not equal to" << std::endl;
	if (t1 < t2) std::cout << "smaller than" << std::endl;
	if (t1 <= t2) std::cout << "smaller than or equal to" << std::endl;
	if (t1 > t2) std::cout << "greater than" << std::endl;
	if (t1 >= t2) std::cout << "greater than or equal to" << std::endl;

	std::cout << s2 << "!\n" << std::endl;
}